

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr c4::yml::from_tag(YamlTag_e tag)

{
  undefined2 in_DI;
  csubstr local_10;
  
  switch(in_DI) {
  case 0:
    basic_substring<char_const>::basic_substring<1ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [1])0x361d1e);
    break;
  case 1:
    basic_substring<char_const>::basic_substring<6ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [6])"!!map");
    break;
  case 2:
    basic_substring<char_const>::basic_substring<7ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [7])"!!omap");
    break;
  case 3:
    basic_substring<char_const>::basic_substring<8ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [8])"!!pairs");
    break;
  case 4:
    basic_substring<char_const>::basic_substring<6ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [6])"!!set");
    break;
  case 5:
    basic_substring<char_const>::basic_substring<6ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [6])"!!seq");
    break;
  case 6:
    basic_substring<char_const>::basic_substring<9ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [9])"!!binary");
    break;
  case 7:
    basic_substring<char_const>::basic_substring<7ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [7])"!!bool");
    break;
  case 8:
    basic_substring<char_const>::basic_substring<8ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [8])"!!float");
    break;
  case 9:
    basic_substring<char_const>::basic_substring<6ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [6])"!!int");
    break;
  case 10:
    basic_substring<char_const>::basic_substring<8ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [8])"!!merge");
    break;
  case 0xb:
    basic_substring<char_const>::basic_substring<7ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [7])"!!null");
    break;
  case 0xc:
    basic_substring<char_const>::basic_substring<6ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [6])"!!str");
    break;
  case 0xd:
    basic_substring<char_const>::basic_substring<12ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [12])"!!timestamp");
    break;
  case 0xe:
    basic_substring<char_const>::basic_substring<8ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [8])"!!value");
    break;
  case 0xf:
    basic_substring<char_const>::basic_substring<7ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [7])"!!yaml");
    break;
  default:
    basic_substring<char_const>::basic_substring<1ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [1])0x361d1e);
  }
  return local_10;
}

Assistant:

csubstr from_tag(YamlTag_e tag)
{
    switch(tag)
    {
    case TAG_MAP:
        return {"!!map"};
    case TAG_OMAP:
        return {"!!omap"};
    case TAG_PAIRS:
        return {"!!pairs"};
    case TAG_SET:
        return {"!!set"};
    case TAG_SEQ:
        return {"!!seq"};
    case TAG_BINARY:
        return {"!!binary"};
    case TAG_BOOL:
        return {"!!bool"};
    case TAG_FLOAT:
        return {"!!float"};
    case TAG_INT:
        return {"!!int"};
    case TAG_MERGE:
        return {"!!merge"};
    case TAG_NULL:
        return {"!!null"};
    case TAG_STR:
        return {"!!str"};
    case TAG_TIMESTAMP:
        return {"!!timestamp"};
    case TAG_VALUE:
        return {"!!value"};
    case TAG_YAML:
        return {"!!yaml"};
    case TAG_NONE:
        return {""};
    }
    return {""};
}